

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

TopLevelNewFunctionBodyResolveInfo * __thiscall
TTD::EventLog::AddNewFunction
          (EventLog *this,FunctionBody *fb,ModuleID moduleId,char16 *source,uint32 sourceLen)

{
  uint32 uVar1;
  uint32 uVar2;
  uint uVar3;
  Utf8SourceInfo *this_00;
  uint *puVar4;
  uint local_40;
  uint32 local_3c;
  TopLevelNewFunctionBodyResolveInfo *pTStack_38;
  uint32 fCount;
  TopLevelNewFunctionBodyResolveInfo *fbInfo;
  char16 *pcStack_28;
  uint32 sourceLen_local;
  char16 *source_local;
  FunctionBody *pFStack_18;
  ModuleID moduleId_local;
  FunctionBody *fb_local;
  EventLog *this_local;
  
  fbInfo._4_4_ = sourceLen;
  pcStack_28 = source;
  source_local._4_4_ = moduleId;
  pFStack_18 = fb;
  fb_local = (FunctionBody *)this;
  pTStack_38 = UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::
               NextOpenEntry(&this->m_newFunctionTopLevelScripts);
  uVar1 = UnorderedArrayList<TTD::NSSnapValues::TopLevelScriptLoadFunctionBodyResolveInfo,_512UL>::
          Count(&this->m_loadedTopLevelScripts);
  uVar2 = UnorderedArrayList<TTD::NSSnapValues::TopLevelNewFunctionBodyResolveInfo,_128UL>::Count
                    (&this->m_newFunctionTopLevelScripts);
  local_3c = UnorderedArrayList<TTD::NSSnapValues::TopLevelEvalFunctionBodyResolveInfo,_128UL>::
             Count(&this->m_evalTopLevelScripts);
  local_3c = uVar1 + uVar2 + local_3c;
  NSSnapValues::ExtractTopLevelNewFunctionBodyInfo
            (pTStack_38,pFStack_18,local_3c,source_local._4_4_,pcStack_28,fbInfo._4_4_,
             &this->m_miscSlabAllocator);
  this_00 = Js::FunctionProxy::GetUtf8SourceInfo((FunctionProxy *)pFStack_18);
  uVar3 = Js::Utf8SourceInfo::GetSourceInfoId(this_00);
  local_40 = uVar3 + 1;
  puVar4 = max<unsigned_int>(&this->m_sourceInfoCount,&local_40);
  this->m_sourceInfoCount = *puVar4;
  return pTStack_38;
}

Assistant:

const NSSnapValues::TopLevelNewFunctionBodyResolveInfo* EventLog::AddNewFunction(Js::FunctionBody* fb, Js::ModuleID moduleId, const char16* source, uint32 sourceLen)
    {
        NSSnapValues::TopLevelNewFunctionBodyResolveInfo* fbInfo = this->m_newFunctionTopLevelScripts.NextOpenEntry();
        uint32 fCount = (this->m_loadedTopLevelScripts.Count() + this->m_newFunctionTopLevelScripts.Count() + this->m_evalTopLevelScripts.Count());

        NSSnapValues::ExtractTopLevelNewFunctionBodyInfo(fbInfo, fb, fCount, moduleId, source, sourceLen, this->m_miscSlabAllocator);
        this->m_sourceInfoCount = max(this->m_sourceInfoCount, fb->GetUtf8SourceInfo()->GetSourceInfoId() + 1);

        return fbInfo;
    }